

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiContext_conflict1 *pIVar5;
  ImGuiColorMod local_2c;
  
  pIVar5 = GImGui;
  pIVar1 = (GImGui->Style).Colors + idx;
  local_2c.BackupValue.x = pIVar1->x;
  local_2c.BackupValue.y = pIVar1->y;
  local_2c.BackupValue.z = pIVar1->z;
  local_2c.BackupValue.w = pIVar1->w;
  local_2c.Col = idx;
  ImVector<ImGuiColorMod>::push_back(&GImGui->ColorStack,&local_2c);
  fVar2 = col->y;
  fVar3 = col->z;
  fVar4 = col->w;
  pIVar1 = (pIVar5->Style).Colors + idx;
  pIVar1->x = col->x;
  pIVar1->y = fVar2;
  pIVar1->z = fVar3;
  pIVar1->w = fVar4;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = col;
}